

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

bool __thiscall cmCursesMainForm::LookForCacheEntry(cmCursesMainForm *this,string *key)

{
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar1;
  cmCursesCacheEntryComposite **ppcVar2;
  bool bVar3;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  __it;
  long lVar4;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  __it_00;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  _Var5;
  string *local_38;
  
  pvVar1 = this->Entries;
  if (pvVar1 == (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 *)0x0) {
    return false;
  }
  __it._M_current =
       (pvVar1->
       super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  ppcVar2 = (pvVar1->
            super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)ppcVar2 - (long)__it._M_current >> 5;
  __it_00._M_current = __it._M_current;
  local_38 = key;
  if (0 < lVar4) {
    __it_00._M_current =
         ((long)ppcVar2 - (long)__it._M_current & 0xffffffffffffffe0U) + __it._M_current;
    lVar4 = lVar4 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                          *)&local_38,__it);
      _Var5._M_current = __it._M_current;
      if (bVar3) goto LAB_0013ddf5;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                          *)&local_38,
                         (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                          )(__it._M_current + 1));
      _Var5._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_0013ddf5;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                          *)&local_38,
                         (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                          )(__it._M_current + 2));
      _Var5._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_0013ddf5;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                          *)&local_38,
                         (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                          )(__it._M_current + 3));
      _Var5._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_0013ddf5;
      __it._M_current = __it._M_current + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)ppcVar2 - (long)__it_00._M_current >> 3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = ppcVar2;
      if ((lVar4 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                                *)&local_38,__it_00), _Var5._M_current = __it_00._M_current, bVar3))
      goto LAB_0013ddf5;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                        *)&local_38,__it_00);
    _Var5._M_current = __it_00._M_current;
    if (bVar3) goto LAB_0013ddf5;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::$_0>::
          operator()((_Iter_pred<cmCursesMainForm::LookForCacheEntry(std::__cxx11::string_const&)::__0>
                      *)&local_38,__it_00);
  _Var5._M_current = __it_00._M_current;
  if (!bVar3) {
    _Var5._M_current = ppcVar2;
  }
LAB_0013ddf5:
  return _Var5._M_current != ppcVar2;
}

Assistant:

bool cmCursesMainForm::LookForCacheEntry(const std::string& key)
{
  return this->Entries &&
    std::any_of(this->Entries->begin(), this->Entries->end(),
                [&key](cmCursesCacheEntryComposite* entry) {
                  return key == entry->Key;
                });
}